

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_chr.cpp
# Opt level: O2

void call_from_thread(int *n_chr,int *m_chr,double *NM_chr,int *NI,double *eta_chr,double *Pj_chr,
                     string query_path,string reference_path,string chrom_size_path,int chr_id,
                     string id,int scale)

{
  string query_path_00;
  string reference_path_00;
  undefined8 in_stack_ffffffffffffff50;
  string in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff78;
  string in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffffa0;
  string local_50 [32];
  
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff90,(string *)query_path._M_dataplus._M_p);
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff70,(string *)query_path._M_string_length);
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff50,(string *)query_path.field_2._M_allocated_capacity);
  std::__cxx11::string::string(local_50,(string *)reference_path._M_dataplus._M_p);
  query_path_00._M_string_length = (size_type)&stack0xffffffffffffff70;
  query_path_00._M_dataplus._M_p = &stack0xffffffffffffff90;
  query_path_00.field_2._M_allocated_capacity = (size_type)&stack0xffffffffffffff50;
  query_path_00.field_2._8_4_ = query_path.field_2._8_4_;
  query_path_00.field_2._12_4_ = 0;
  reference_path_00._M_string_length._0_4_ = (undefined4)reference_path._M_string_length;
  reference_path_00._M_dataplus._M_p = (pointer)local_50;
  reference_path_00._M_string_length._4_4_ = 0;
  reference_path_00.field_2._M_allocated_capacity = (size_type)Pj_chr;
  reference_path_00.field_2._8_8_ = in_stack_ffffffffffffff50;
  chrom(n_chr,m_chr,NM_chr,NI,eta_chr,Pj_chr,query_path_00,reference_path_00,
        in_stack_ffffffffffffff58,in_stack_ffffffffffffff78,in_stack_ffffffffffffff80,
        in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  return;
}

Assistant:

void call_from_thread(int* n_chr, int* m_chr, double* NM_chr, int* NI, double* eta_chr, double* Pj_chr, 
                      string query_path, string reference_path, string chrom_size_path, int chr_id,
                      string id, int scale)
{
    chrom(n_chr, m_chr, NM_chr, NI, eta_chr, Pj_chr, query_path, reference_path, chrom_size_path,
                      chr_id, id, scale);
}